

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O0

EGUI_BUTTON_IMAGE_STATE __thiscall
irr::gui::CGUIButton::getImageState(CGUIButton *this,bool pressed)

{
  byte bVar1;
  long *plVar2;
  ulong uVar3;
  byte in_SIL;
  long *in_RDI;
  bool bVar4;
  bool mouseOver;
  bool focused;
  EGUI_BUTTON_IMAGE_STATE state;
  EGUI_BUTTON_IMAGE_STATE local_10;
  
  local_10 = EGBIS_IMAGE_DISABLED;
  bVar1 = (**(code **)(*(long *)in_RDI[0x25] + 0x28))((long *)in_RDI[0x25],in_RDI,0);
  plVar2 = (long *)(**(code **)(*(long *)in_RDI[0x25] + 0x18))();
  bVar4 = plVar2 != in_RDI;
  uVar3 = (**(code **)(*in_RDI + 0x90))();
  if ((uVar3 & 1) != 0) {
    if ((in_SIL & 1) == 0) {
      if (((bVar1 & 1) == 0) || (bVar4)) {
        if ((bVar1 & 1) == 0) {
          local_10 = (EGUI_BUTTON_IMAGE_STATE)!bVar4;
        }
        else {
          local_10 = EGBIS_IMAGE_UP_FOCUSED;
        }
      }
      else {
        local_10 = EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER;
      }
    }
    else if (((bVar1 & 1) == 0) || (bVar4)) {
      if ((bVar1 & 1) == 0) {
        if (bVar4) {
          local_10 = EGBIS_IMAGE_DOWN;
        }
        else {
          local_10 = EGBIS_IMAGE_DOWN_MOUSEOVER;
        }
      }
      else {
        local_10 = EGBIS_IMAGE_DOWN_FOCUSED;
      }
    }
    else {
      local_10 = EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER;
    }
  }
  do {
    while( true ) {
      bVar4 = false;
      if (local_10 != EGBIS_IMAGE_UP) {
        bVar4 = in_RDI[(ulong)local_10 * 3 + 0x32] == 0;
      }
      if (!bVar4) {
        return local_10;
      }
      if (local_10 - EGBIS_IMAGE_UP_FOCUSED < 6 || local_10 == EGBIS_IMAGE_DISABLED) break;
switchD_0039ca4f_caseD_39ca9e:
      local_10 = EGBIS_IMAGE_UP;
    }
    switch((long)&switchD_0039ca4f::switchdataD_003e5a70 +
           (long)(int)(&switchD_0039ca4f::switchdataD_003e5a70)[local_10 - EGBIS_IMAGE_UP_FOCUSED])
    {
    case 0x39ca51:
      local_10 = EGBIS_IMAGE_UP_MOUSEOVER;
      break;
    case 0x39ca5b:
      local_10 = EGBIS_IMAGE_UP_FOCUSED;
      break;
    case 0x39ca65:
      local_10 = EGBIS_IMAGE_DOWN;
      break;
    case 0x39ca6f:
      local_10 = EGBIS_IMAGE_DOWN_MOUSEOVER;
      break;
    case 0x39ca79:
      local_10 = EGBIS_IMAGE_DOWN_FOCUSED;
      break;
    case 0x39ca83:
      if ((in_SIL & 1) == 0) {
        local_10 = EGBIS_IMAGE_UP;
      }
      else {
        local_10 = EGBIS_IMAGE_DOWN;
      }
      break;
    case 0x39ca9e:
      goto switchD_0039ca4f_caseD_39ca9e;
    }
  } while( true );
}

Assistant:

EGUI_BUTTON_IMAGE_STATE CGUIButton::getImageState(bool pressed) const
{
	// figure state we should have
	EGUI_BUTTON_IMAGE_STATE state = EGBIS_IMAGE_DISABLED;
	bool focused = Environment->hasFocus(this);
	bool mouseOver = static_cast<const IGUIElement *>(Environment->getHovered()) == this; // (static cast for Borland)
	if (isEnabled()) {
		if (pressed) {
			if (focused && mouseOver)
				state = EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER;
			else if (focused)
				state = EGBIS_IMAGE_DOWN_FOCUSED;
			else if (mouseOver)
				state = EGBIS_IMAGE_DOWN_MOUSEOVER;
			else
				state = EGBIS_IMAGE_DOWN;
		} else // !pressed
		{
			if (focused && mouseOver)
				state = EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER;
			else if (focused)
				state = EGBIS_IMAGE_UP_FOCUSED;
			else if (mouseOver)
				state = EGBIS_IMAGE_UP_MOUSEOVER;
			else
				state = EGBIS_IMAGE_UP;
		}
	}

	// find a compatible state that has images
	while (state != EGBIS_IMAGE_UP && !ButtonImages[(u32)state].Texture) {
		switch (state) {
		case EGBIS_IMAGE_UP_FOCUSED:
			state = EGBIS_IMAGE_UP_MOUSEOVER;
			break;
		case EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER:
			state = EGBIS_IMAGE_UP_FOCUSED;
			break;
		case EGBIS_IMAGE_DOWN_MOUSEOVER:
			state = EGBIS_IMAGE_DOWN;
			break;
		case EGBIS_IMAGE_DOWN_FOCUSED:
			state = EGBIS_IMAGE_DOWN_MOUSEOVER;
			break;
		case EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER:
			state = EGBIS_IMAGE_DOWN_FOCUSED;
			break;
		case EGBIS_IMAGE_DISABLED:
			if (pressed)
				state = EGBIS_IMAGE_DOWN;
			else
				state = EGBIS_IMAGE_UP;
			break;
		default:
			state = EGBIS_IMAGE_UP;
		}
	}

	return state;
}